

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AngleDeception.cpp
# Opt level: O2

bool __thiscall DIS::AngleDeception::operator==(AngleDeception *this,AngleDeception *rhs)

{
  bool bVar1;
  byte bVar2;
  
  if ((this->_azimuthWidth != rhs->_azimuthWidth) ||
     (NAN(this->_azimuthWidth) || NAN(rhs->_azimuthWidth))) {
    bVar1 = false;
  }
  else {
    bVar1 = ((((((this->_padding2 == rhs->_padding2 && this->_stateIndicator == rhs->_stateIndicator
                 ) && this->_beamNumber == rhs->_beamNumber) &&
               this->_emitterNumber == rhs->_emitterNumber) && this->_padding == rhs->_padding) &&
             this->_recordLength == rhs->_recordLength) && this->_recordType == rhs->_recordType) &&
            this->_azimuthOffset == rhs->_azimuthOffset;
  }
  if ((this->_azimuthPullAcceleration != rhs->_azimuthPullAcceleration) ||
     (NAN(this->_azimuthPullAcceleration) || NAN(rhs->_azimuthPullAcceleration))) {
    bVar2 = 0;
  }
  else {
    bVar2 = this->_azimuthPullRate == rhs->_azimuthPullRate & bVar1;
  }
  if ((this->_elevationWidth != rhs->_elevationWidth) ||
     (NAN(this->_elevationWidth) || NAN(rhs->_elevationWidth))) {
    bVar2 = 0;
  }
  else {
    bVar2 = this->_elevationOffset == rhs->_elevationOffset & bVar2;
  }
  if ((this->_elevationPullAcceleration != rhs->_elevationPullAcceleration) ||
     (NAN(this->_elevationPullAcceleration) || NAN(rhs->_elevationPullAcceleration))) {
    bVar2 = 0;
  }
  else {
    bVar2 = this->_elevationPullRate == rhs->_elevationPullRate & bVar2;
  }
  return (bool)(this->_padding3 == rhs->_padding3 & bVar2);
}

Assistant:

bool AngleDeception::operator ==(const AngleDeception& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_recordType == rhs._recordType) ) ivarsEqual = false;
     if( ! (_recordLength == rhs._recordLength) ) ivarsEqual = false;
     if( ! (_padding == rhs._padding) ) ivarsEqual = false;
     if( ! (_emitterNumber == rhs._emitterNumber) ) ivarsEqual = false;
     if( ! (_beamNumber == rhs._beamNumber) ) ivarsEqual = false;
     if( ! (_stateIndicator == rhs._stateIndicator) ) ivarsEqual = false;
     if( ! (_padding2 == rhs._padding2) ) ivarsEqual = false;
     if( ! (_azimuthOffset == rhs._azimuthOffset) ) ivarsEqual = false;
     if( ! (_azimuthWidth == rhs._azimuthWidth) ) ivarsEqual = false;
     if( ! (_azimuthPullRate == rhs._azimuthPullRate) ) ivarsEqual = false;
     if( ! (_azimuthPullAcceleration == rhs._azimuthPullAcceleration) ) ivarsEqual = false;
     if( ! (_elevationOffset == rhs._elevationOffset) ) ivarsEqual = false;
     if( ! (_elevationWidth == rhs._elevationWidth) ) ivarsEqual = false;
     if( ! (_elevationPullRate == rhs._elevationPullRate) ) ivarsEqual = false;
     if( ! (_elevationPullAcceleration == rhs._elevationPullAcceleration) ) ivarsEqual = false;
     if( ! (_padding3 == rhs._padding3) ) ivarsEqual = false;

    return ivarsEqual;
 }